

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

Rule * slang::ast::RandSeqProductionSymbol::createRule
                 (Rule *__return_storage_ptr__,RsRuleSyntax *syntax,ASTContext *context,
                 StatementBlockSymbol *ruleBlock)

{
  pointer ppRVar1;
  Scope *pSVar2;
  Compilation *this;
  size_type sVar3;
  SyntaxNode *this_00;
  RsWeightClauseSyntax *pRVar4;
  ExpressionSyntax *pEVar5;
  RandJoinClauseSyntax *pRVar6;
  Type *pTVar7;
  RsRuleSyntax *pRVar8;
  Rule *pRVar9;
  bool bVar10;
  int iVar11;
  RsCaseSyntax *syntax_00;
  RsRepeatSyntax *pRVar12;
  undefined4 extraout_var_00;
  RsIfElseSyntax *pRVar13;
  undefined4 extraout_var_01;
  RsProdItemSyntax *pRVar14;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  undefined4 extraout_var_03;
  Diagnostic *diag;
  undefined4 extraout_var_04;
  logic_error *this_02;
  long *plVar15;
  size_type *psVar16;
  ProdBase *pPVar17;
  char *func;
  Symbol *extraout_RDX;
  Symbol *extraout_RDX_00;
  Symbol *extraout_RDX_01;
  Symbol *extraout_RDX_02;
  Symbol *extraout_RDX_03;
  Symbol *extraout_RDX_04;
  Symbol *extraout_RDX_05;
  Symbol *extraout_RDX_06;
  Symbol *extraout_RDX_07;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> sVar19;
  Symbol *extraout_RDX_08;
  size_type extraout_RDX_09;
  Symbol *pSVar20;
  Expression *pEVar21;
  char *file;
  char *expr;
  pointer ppRVar22;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
  iVar23;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> tmp;
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> prods;
  ProdItem item;
  ProdItem ifItem;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_180;
  SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> local_168 [2];
  undefined1 local_128 [16];
  ProdBase local_118 [4];
  SourceLocation SStack_108;
  ASTContext *local_100;
  undefined8 local_f8;
  RsRuleSyntax *local_f0;
  undefined1 local_e8 [16];
  pointer local_d8;
  size_type sStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Expression *local_a8;
  StatementBlockSymbol *local_a0;
  Rule *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> this_01;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> sVar18;
  
  local_a0 = ruleBlock;
  local_98 = __return_storage_ptr__;
  iVar23 = Scope::membersOfType<slang::ast::StatementBlockSymbol>(&ruleBlock->super_Scope);
  sVar18 = iVar23.m_end.current;
  this_01 = iVar23.m_begin.current;
  pSVar2 = (context->scope).ptr;
  if (pSVar2 == (Scope *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
              );
  }
  this = pSVar2->compilation;
  local_168[0].data_ = (pointer)local_168[0].firstElement;
  local_168[0].len = 0;
  local_168[0].cap = 5;
  sVar3 = (syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.size_;
  local_f0 = syntax;
  if (sVar3 != 0) {
    ppRVar22 = (syntax->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>.
               data_;
    ppRVar1 = ppRVar22 + sVar3;
    local_180.current = this_01.current;
    do {
      this_00 = &(*ppRVar22)->super_SyntaxNode;
      switch(this_00->kind) {
      case RsCase:
        syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::RsCaseSyntax>(this_00);
        local_128._0_8_ = createCaseProd(syntax_00,context);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
        emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)
                   local_168,(ProdBase **)local_128);
        sVar19.current = extraout_RDX;
        break;
      case RsCodeBlock:
        if (local_180.current == sVar18.current) {
          assert::assertFailed
                    ("blockIt != blockRange.end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,0x5bd,
                     "static RandSeqProductionSymbol::Rule slang::ast::RandSeqProductionSymbol::createRule(const RsRuleSyntax &, const ASTContext &, const StatementBlockSymbol &)"
                    );
        }
        for (pSVar20 = ((Symbol *)&(local_180.current)->kind)->nextInScope;
            (pSVar20 != (Symbol *)0x0 && (pSVar20->kind != StatementBlock));
            pSVar20 = pSVar20->nextInScope) {
        }
        if (((Symbol *)&(local_180.current)->kind)->kind != StatementBlock) {
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,
                     "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::StatementBlockSymbol]"
                    );
        }
        local_128._0_8_ =
             BumpAllocator::
             emplace<slang::ast::RandSeqProductionSymbol::CodeBlockProd,slang::ast::StatementBlockSymbol_const&>
                       (&this->super_BumpAllocator,(StatementBlockSymbol *)local_180.current);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
        emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)
                   local_168,(ProdBase **)local_128);
        sVar19.current = extraout_RDX_03;
        local_180.current = pSVar20;
        break;
      default:
        this_02 = (logic_error *)__cxa_allocate_exception(0x10);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,"");
        plVar15 = (long *)std::__cxx11::string::append((char *)local_70);
        local_90._M_dataplus._M_p = (pointer)*plVar15;
        psVar16 = (size_type *)(plVar15 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar16) {
          local_90.field_2._M_allocated_capacity = *psVar16;
          local_90.field_2._8_8_ = plVar15[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar16;
        }
        local_90._M_string_length = plVar15[1];
        *plVar15 = (long)psVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::to_string(&local_50,0x5dd);
        std::operator+(&local_c8,&local_90,&local_50);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_e8._0_8_ = *plVar15;
        pPVar17 = (ProdBase *)(plVar15 + 2);
        if ((ProdBase *)local_e8._0_8_ == pPVar17) {
          local_d8 = *(pointer *)pPVar17;
          sStack_d0 = plVar15[3];
          local_e8._0_8_ = (ProdBase *)&local_d8;
        }
        else {
          local_d8 = *(pointer *)pPVar17;
        }
        local_e8._8_8_ = plVar15[1];
        *plVar15 = (long)pPVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append(local_e8);
        local_128._0_8_ = *plVar15;
        pPVar17 = (ProdBase *)(plVar15 + 2);
        if ((ProdBase *)local_128._0_8_ == pPVar17) {
          local_118._0_8_ = *(undefined8 *)pPVar17;
          local_118._8_8_ = plVar15[3];
          local_128._0_8_ = local_118;
        }
        else {
          local_118._0_8_ = *(undefined8 *)pPVar17;
        }
        local_128._8_8_ = plVar15[1];
        *plVar15 = (long)pPVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::logic_error::logic_error(this_02,(string *)local_128);
        __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      case RsIfElse:
        pRVar13 = slang::syntax::SyntaxNode::as<slang::syntax::RsIfElseSyntax>(this_00);
        pEVar5 = (pRVar13->condition).ptr;
        if (pEVar5 == (ExpressionSyntax *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                    );
        }
        iVar11 = Expression::bind((int)pEVar5,(sockaddr *)context,0);
        pEVar21 = (Expression *)CONCAT44(extraout_var_01,iVar11);
        pRVar14 = (pRVar13->ifItem).ptr;
        if (pRVar14 == (RsProdItemSyntax *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::RsProdItemSyntax *>::get() const [T = slang::syntax::RsProdItemSyntax *]"
                    );
        }
        createProdItem((ProdItem *)local_e8,pRVar14,context);
        SStack_108 = (SourceLocation)((ulong)SStack_108 & 0xffffffffffffff00);
        if (pRVar13->elseClause != (RsElseClauseSyntax *)0x0) {
          pRVar14 = (pRVar13->elseClause->item).ptr;
          if (pRVar14 == (RsProdItemSyntax *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<slang::syntax::RsProdItemSyntax *>::get() const [T = slang::syntax::RsProdItemSyntax *]"
                      );
          }
          createProdItem((ProdItem *)&local_c8,pRVar14,context);
          local_128._0_8_ = local_c8._M_dataplus._M_p;
          local_128._8_8_ = local_c8._M_string_length;
          local_118[0].kind = local_c8.field_2._M_allocated_capacity._0_4_;
          local_118[1].kind = local_c8.field_2._M_allocated_capacity._4_4_;
          local_118[2].kind = local_c8.field_2._8_4_;
          local_118[3].kind = local_c8.field_2._12_4_;
          if ((bool)SStack_108._0_1_ == false) {
            SStack_108._0_1_ = 1;
          }
        }
        bVar10 = Expression::bad(pEVar21);
        if (!bVar10) {
          ASTContext::requireBooleanConvertible(context,pEVar21);
        }
        local_c8._M_dataplus._M_p =
             (pointer)BumpAllocator::
                      emplace<slang::ast::RandSeqProductionSymbol::IfElseProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                                (&this->super_BumpAllocator,pEVar21,(ProdItem *)local_e8,
                                 (optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)
                                 local_128);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
        emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)
                   local_168,(ProdBase **)&local_c8);
        sVar19.current = extraout_RDX_01;
        break;
      case RsProdItem:
        pRVar14 = slang::syntax::SyntaxNode::as<slang::syntax::RsProdItemSyntax>(this_00);
        createProdItem((ProdItem *)local_128,pRVar14,context);
        local_e8._0_8_ =
             BumpAllocator::
             emplace<slang::ast::RandSeqProductionSymbol::ProdItem,slang::ast::RandSeqProductionSymbol::ProdItem>
                       (&this->super_BumpAllocator,(ProdItem *)local_128);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
        emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)
                   local_168,(ProdBase **)local_e8);
        sVar19.current = extraout_RDX_02;
        break;
      case RsRepeat:
        pRVar12 = slang::syntax::SyntaxNode::as<slang::syntax::RsRepeatSyntax>(this_00);
        pEVar5 = (pRVar12->expr).ptr;
        if (pEVar5 == (ExpressionSyntax *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                    );
        }
        iVar11 = Expression::bind((int)pEVar5,(sockaddr *)context,0);
        pRVar14 = (pRVar12->item).ptr;
        if (pRVar14 == (RsProdItemSyntax *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::RsProdItemSyntax *>::get() const [T = slang::syntax::RsProdItemSyntax *]"
                    );
        }
        createProdItem((ProdItem *)local_128,pRVar14,context);
        local_e8._0_8_ =
             BumpAllocator::
             emplace<slang::ast::RandSeqProductionSymbol::RepeatProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&>
                       (&this->super_BumpAllocator,(Expression *)CONCAT44(extraout_var_00,iVar11),
                        (ProdItem *)local_128);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*>::
        emplace_back<slang::ast::RandSeqProductionSymbol::ProdBase_const*>
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdBase_const*> *)
                   local_168,(ProdBase **)local_e8);
        ASTContext::requireIntegral(context,(Expression *)CONCAT44(extraout_var_00,iVar11));
        sVar19.current = extraout_RDX_00;
      }
      iVar23.m_end.current = sVar19.current;
      iVar23.m_begin.current = local_180.current;
      ppRVar22 = ppRVar22 + 1;
    } while (ppRVar22 != ppRVar1);
  }
  pRVar8 = local_f0;
  sVar19 = iVar23.m_end.current;
  local_180 = iVar23.m_begin.current;
  pRVar4 = local_f0->weightClause;
  if (pRVar4 == (RsWeightClauseSyntax *)0x0) {
    local_f8 = 0;
    pEVar21 = (Expression *)0x0;
  }
  else {
    pEVar5 = (pRVar4->weight).ptr;
    if (pEVar5 == (ExpressionSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      iVar11 = 0x26;
      file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
      ;
      expr = "ptr";
LAB_001c8b5b:
      assert::assertFailed(expr,file,iVar11,func);
    }
    iVar11 = Expression::bind((int)pEVar5,(sockaddr *)context,0);
    pEVar21 = (Expression *)CONCAT44(extraout_var_02,iVar11);
    ASTContext::requireIntegral(context,pEVar21);
    sVar19.current = extraout_RDX_04;
    if (pRVar4->codeBlock == (RsProdSyntax *)0x0) {
      local_f8 = 0;
    }
    else {
      if (local_180.current == sVar18.current) {
        func = 
        "static RandSeqProductionSymbol::Rule slang::ast::RandSeqProductionSymbol::createRule(const RsRuleSyntax &, const ASTContext &, const StatementBlockSymbol &)"
        ;
        iVar11 = 0x5e8;
        file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
        ;
        expr = "blockIt != blockRange.end()";
        goto LAB_001c8b5b;
      }
      local_f8 = CONCAT71(extraout_var,1);
      if (((Symbol *)&(local_180.current)->kind)->kind != StatementBlock) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::StatementBlockSymbol]")
        ;
      }
    }
  }
  pRVar6 = pRVar8->randJoin;
  local_a8 = pEVar21;
  if ((pRVar6 == (RandJoinClauseSyntax *)0x0) ||
     (pRVar6->expr == (ParenthesizedExpressionSyntax *)0x0)) {
    pEVar21 = (Expression *)0x0;
  }
  else {
    iVar11 = Expression::bind((int)pRVar6->expr,(sockaddr *)context,0);
    pEVar21 = (Expression *)CONCAT44(extraout_var_03,iVar11);
    bVar10 = Expression::bad(pEVar21);
    sVar19.current = extraout_RDX_05;
    if (!bVar10) {
      pTVar7 = (pEVar21->type).ptr;
      if (pTVar7 == (Type *)0x0) {
LAB_001c8b60:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                  );
      }
      bVar10 = Type::isNumeric(pTVar7);
      sVar19.current = extraout_RDX_06;
      if (!bVar10) {
        diag = ASTContext::addDiag(context,(DiagCode)0x890006,pEVar21->sourceRange);
        pTVar7 = (pEVar21->type).ptr;
        if (pTVar7 == (Type *)0x0) goto LAB_001c8b60;
        ast::operator<<(diag,pTVar7);
        sVar19.current = extraout_RDX_07;
      }
    }
  }
  if (this_01.current != sVar18.current) {
    do {
      if (((Symbol *)&(this_01.current)->kind)->kind != StatementBlock) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::StatementBlockSymbol]")
        ;
      }
      local_118[2].kind = Item;
      local_118[3].kind = Item;
      SStack_108 = (SourceLocation)0x0;
      local_128._0_8_ = (IfElseProd *)0x0;
      local_128._8_8_ = (RandSeqProductionSymbol *)0x0;
      local_118[0].kind = 4;
      local_100 = context;
      StatementBlockSymbol::getStatement
                ((StatementBlockSymbol *)this_01.current,context,(StatementContext *)local_128);
      Statement::StatementContext::~StatementContext((StatementContext *)local_128);
      do {
        this_01.current = ((Symbol *)&(this_01.current)->kind)->nextInScope;
        if ((StatementBlockSymbol *)this_01.current == (StatementBlockSymbol *)0x0) break;
      } while (((Symbol *)&(this_01.current)->kind)->kind != StatementBlock);
      sVar19.current = extraout_RDX_08;
    } while (this_01.current != sVar18.current);
  }
  iVar11 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::copy
                     (local_168,(EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)sVar19.current);
  pRVar9 = local_98;
  (local_98->ruleBlock).ptr = local_a0;
  (local_98->prods).data_ = (pointer)CONCAT44(extraout_var_04,iVar11);
  (local_98->prods).size_ = extraout_RDX_09;
  local_98->weightExpr = local_a8;
  local_98->randJoinExpr = pEVar21;
  (local_98->codeBlock).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._M_payload.
  _M_value.super_ProdBase.kind = CodeBlock;
  *(Symbol **)
   ((long)&(local_98->codeBlock).
           super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
           _M_payload.
           super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
           _M_payload + 8) = local_180.current;
  (local_98->codeBlock).
  super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>._M_engaged =
       SUB81(local_f8,0);
  local_98->isRandJoin = pRVar6 != (RandJoinClauseSyntax *)0x0;
  if (local_168[0].data_ != (pointer)local_168[0].firstElement) {
    free(local_168[0].data_);
  }
  return pRVar9;
}

Assistant:

RandSeqProductionSymbol::Rule RandSeqProductionSymbol::createRule(
    const RsRuleSyntax& syntax, const ASTContext& context, const StatementBlockSymbol& ruleBlock) {

    auto blockRange = ruleBlock.membersOfType<StatementBlockSymbol>();
    auto blockIt = blockRange.begin();

    auto& comp = context.getCompilation();
    SmallVector<const ProdBase*> prods;
    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                prods.push_back(
                    comp.emplace<ProdItem>(createProdItem(p->as<RsProdItemSyntax>(), context)));
                break;
            case SyntaxKind::RsCodeBlock: {
                ASSERT(blockIt != blockRange.end());
                prods.push_back(comp.emplace<CodeBlockProd>(*blockIt++));
                break;
            }
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                auto& expr = Expression::bind(*ries.condition, context);
                auto ifItem = createProdItem(*ries.ifItem, context);

                std::optional<ProdItem> elseItem;
                if (ries.elseClause)
                    elseItem = createProdItem(*ries.elseClause->item, context);

                if (!expr.bad())
                    context.requireBooleanConvertible(expr);

                prods.push_back(comp.emplace<IfElseProd>(expr, ifItem, elseItem));
                break;
            }
            case SyntaxKind::RsRepeat: {
                auto& rrs = p->as<RsRepeatSyntax>();
                auto& expr = Expression::bind(*rrs.expr, context);
                auto item = createProdItem(*rrs.item, context);
                prods.push_back(comp.emplace<RepeatProd>(expr, item));

                context.requireIntegral(expr);
                break;
            }
            case SyntaxKind::RsCase:
                prods.push_back(&createCaseProd(p->as<RsCaseSyntax>(), context));
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    const Expression* weightExpr = nullptr;
    std::optional<CodeBlockProd> codeBlock;
    if (auto wc = syntax.weightClause) {
        weightExpr = &Expression::bind(*wc->weight, context);
        context.requireIntegral(*weightExpr);

        if (wc->codeBlock) {
            ASSERT(blockIt != blockRange.end());
            codeBlock = CodeBlockProd(*blockIt++);
        }
    }

    bool isRandJoin = false;
    const Expression* randJoinExpr = nullptr;
    if (syntax.randJoin) {
        isRandJoin = true;
        if (syntax.randJoin->expr) {
            randJoinExpr = &Expression::bind(*syntax.randJoin->expr, context);

            if (!randJoinExpr->bad() && !randJoinExpr->type->isNumeric()) {
                context.addDiag(diag::RandJoinNotNumeric, randJoinExpr->sourceRange)
                    << *randJoinExpr->type;
            }
        }
    }

    for (auto& block : blockRange) {
        Statement::StatementContext stmtCtx(context);
        stmtCtx.flags = StatementFlags::InRandSeq;
        block.getStatement(context, stmtCtx);
    }

    return {ruleBlock, prods.copy(comp), weightExpr, randJoinExpr, codeBlock, isRandJoin};
}